

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_98 [5];
  
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (local_98,&this->m_cli,argc,argv,&this->m_configData);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::_M_move_assign
            (&this->m_unusedTokens,local_98);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(local_98);
  if (unusedOptionBehaviour == Fail) {
    enforceNoUsedTokens(this);
  }
  if ((this->m_configData).showHelp == true) {
    showHelp(this,&(this->m_configData).processName);
  }
  Ptr<Catch::Config>::reset(&this->m_config);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char* const argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( unusedOptionBehaviour == OnUnusedOptions::Fail )
                    enforceNoUsedTokens();
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    std::cerr   << "\nError in input:\n"
                                << Text( ex.what(), TextAttributes().setIndent(2) )
                                << "\n\n";
                }
                m_cli.usage( std::cout, m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }